

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O2

void __thiscall
ValidateFootprint::ReadFirstFootprintLine(ValidateFootprint *this,OASIS_FLOAT *totalProbability)

{
  Validate *this_00;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  
  this_00 = &this->super_Validate;
  pcVar3 = fgets(this_00->line_,0x1000,_stdin);
  if (pcVar3 != (char *)0x0) {
    iVar1 = ScanLine(this);
    if (iVar1 == 4) {
      iVar1 = Validate::CheckIDDoesNotExceedMaxLimit(this_00,this->eveIDName_,this->initialEveID_);
      (this->fr_).event_id = iVar1;
      uVar2 = Validate::CheckIDDoesNotExceedMaxLimit
                        (this_00,this->areaperilIDName_,this->initialAreaperilID_);
      (this->fr_).super_EventRow.areaperil_id = uVar2;
      if (this->validationCheck_ != false) {
        StoreLine(this);
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->intensityBinIDs_,&(this->fr_).super_EventRow.intensity_bin_id);
        *totalProbability = (this->fr_).super_EventRow.probability;
        iVar1 = (this->fr_).super_EventRow.intensity_bin_id;
        if (this->maxIntensityBin_ < iVar1) {
          this->maxIntensityBin_ = iVar1;
        }
        return;
      }
      (**this->_vptr_ValidateFootprint)(this);
      return;
    }
    fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
            (ulong)(uint)(this->super_Validate).lineno_,this_00);
    Validate::PrintErrorMessage(this_00);
  }
  fwrite("ERROR: Empty file\n",0x12,1,_stderr);
  Validate::PrintErrorMessage(this_00);
  return;
}

Assistant:

void ValidateFootprint::ReadFirstFootprintLine(OASIS_FLOAT &totalProbability) {
/* After skipping header, first line of footprint csv file is read primarily to
 * establish initial event ID. */

  if (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      fr_.event_id = CheckIDDoesNotExceedMaxLimit(eveIDName_, initialEveID_);
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
      // If areaperil ID is of data type unsigned long long, it is not possible
      // to check for overflow
      fr_.areaperil_id = initialAreaperilID_;
#else
      fr_.areaperil_id = CheckIDDoesNotExceedMaxLimit(areaperilIDName_,
						      initialAreaperilID_);
#endif

      // In the case when there are no validation checks to perform, the
      // initial previous event ID must still be set and line number
      // incremented. In this case, total probability is not used.
      if (!validationCheck_) {

        SetPreviousEventID();

	return;

      }

      StoreLine();
      intensityBinIDs_.push_back(fr_.intensity_bin_id);
      totalProbability = fr_.probability;

      SetMaximumIntensityBinIndex();

      return;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  fprintf(stderr, "ERROR: Empty file\n");
  PrintErrorMessage();

}